

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterferentGraphBuilder.cpp
# Opt level: O1

void addEdgesFromMoveLine
               (CodeLine *line,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *graph,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *ignoreList)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  MoveRegRegCommand *this;
  _Base_ptr p_Var4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  _Rb_tree_header *p_Var6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> outTemp;
  string target;
  string source;
  string local_128;
  string local_108;
  undefined1 *local_e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d8;
  string local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  local_e0 = graph;
  this = (MoveRegRegCommand *)
         __dynamic_cast((line->command).
                        super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,&AssemblyCode::AssemblyCommand::typeinfo,
                        &AssemblyCode::MoveRegRegCommand::typeinfo,0);
  AssemblyCode::MoveRegRegCommand::getTarget_abi_cxx11_(&local_108,this);
  AssemblyCode::MoveRegRegCommand::getSource_abi_cxx11_(&local_50,this);
  p_Var4 = (line->liveOutTemps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(line->liveOutTemps)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    local_e8 = local_80;
    local_d8 = ignoreList;
    do {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,*(long *)(p_Var4 + 1),
                 (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
      if ((local_128._M_string_length != local_50._M_string_length) ||
         ((local_128._M_string_length != 0 &&
          (iVar3 = bcmp(local_128._M_dataplus._M_p,local_50._M_dataplus._M_p,
                        local_128._M_string_length), iVar3 != 0)))) {
        bVar2 = isInIgnoreList(&local_128);
        if ((bVar2) || (bVar2 = isInIgnoreList(&local_108), bVar2)) {
          bVar2 = false;
LAB_00155480:
          bVar1 = false;
          bVar7 = false;
        }
        else {
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,local_128._M_dataplus._M_p,
                     local_128._M_dataplus._M_p + local_128._M_string_length);
          _Var5 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            ((ignoreList->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                             (ignoreList->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish,local_90);
          if (_Var5._M_current !=
              (ignoreList->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            bVar2 = true;
            goto LAB_00155480;
          }
          local_b0[0] = local_a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b0,local_108._M_dataplus._M_p,
                     local_108._M_dataplus._M_p + local_108._M_string_length);
          _Var5 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            ((ignoreList->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                             (ignoreList->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish,local_b0);
          if (_Var5._M_current ==
              (ignoreList->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            bVar2 = true;
            if (local_108._M_string_length == local_128._M_string_length) {
              if (local_108._M_string_length == 0) goto LAB_00155608;
              iVar3 = bcmp(local_108._M_dataplus._M_p,local_128._M_dataplus._M_p,
                           local_108._M_string_length);
              bVar7 = iVar3 != 0;
              goto LAB_0015560a;
            }
            bVar1 = true;
            bVar7 = true;
          }
          else {
LAB_00155608:
            bVar7 = false;
LAB_0015560a:
            bVar2 = true;
            bVar1 = true;
          }
        }
        if ((bVar1) && (local_b0[0] != local_a0)) {
          operator_delete(local_b0[0]);
        }
        if ((bVar2) && (local_90[0] != local_80)) {
          operator_delete(local_90[0]);
        }
        ignoreList = local_d8;
        if (bVar7) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,local_108._M_dataplus._M_p,
                     local_108._M_dataplus._M_p + local_108._M_string_length);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,local_128._M_dataplus._M_p,
                     local_128._M_dataplus._M_p + local_128._M_string_length);
          AssemblyCode::addNotOrientedEdge(&local_d0,&local_70,local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  return;
}

Assistant:

void addEdgesFromMoveLine(AssemblyCode::CodeLine& line, std::map<std::string, std::set<std::string>>& graph,
                          std::vector<std::string>& ignoreList) {
    AssemblyCode::MoveRegRegCommand* moveRegRegCommand =
            dynamic_cast<AssemblyCode::MoveRegRegCommand*>(line.command.get());

    std::string target = moveRegRegCommand->getTarget();
    std::string source = moveRegRegCommand->getSource();

    for (auto outTemp : line.liveOutTemps) {
        if (outTemp == source) {
            continue;
        }

        if (!isInIgnoreList(outTemp) && !isInIgnoreList(target) &&
                !isInDynamicIgnoreList(outTemp, ignoreList) && !isInDynamicIgnoreList(target, ignoreList) &&
                target != outTemp) {
            AssemblyCode::addNotOrientedEdge( target, outTemp, graph );
        }
    }
}